

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_scanner.cpp
# Opt level: O3

void __thiscall duckdb::CSVFileScan::InitializeFileNamesTypes(CSVFileScan *this)

{
  size_type __n;
  pointer pMVar1;
  pointer pMVar2;
  pointer ppVar3;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *this_00;
  reference pvVar4;
  reference pvVar5;
  iterator iVar6;
  ulong uVar7;
  pointer ppVar8;
  vector<duckdb::LogicalType,_true> *this_01;
  MultiFileLocalIndex local_idx;
  size_type __n_00;
  idx_t i;
  pointer __n_01;
  long lVar9;
  vector<duckdb::LogicalType,_true> sorted_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  undefined8 local_48;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *local_40;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_38;
  
  this_01 = &this->file_types;
  if ((this->super_BaseFileReader).column_ids.column_ids.
      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(this->super_BaseFileReader).column_ids.column_ids.
               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               .
               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
               &LogicalType::VARCHAR);
    local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_insert_unique<unsigned_long>(&(this->projected_columns)._M_t,(unsigned_long *)&local_68);
    local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_68.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_48 = (ulong)local_48._4_4_ << 0x20;
    ::std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<int,int>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->projection_ids,(int *)&local_68,(int *)&local_48);
  }
  else {
    local_40 = &(this->super_BaseFileReader).column_ids;
    local_38 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->projection_ids;
    __n_01 = (pointer)0x0;
    do {
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = __n_01;
      pvVar4 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                         (&local_40->column_ids,(size_type)__n_01);
      __n = pvVar4->column_id;
      pvVar5 = vector<duckdb::LogicalType,_true>::operator[](&this->types,__n);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,pvVar5);
      local_48 = __n;
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_insert_unique<unsigned_long>(&(this->projected_columns)._M_t,&local_48);
      local_48 = __n;
      ::std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<unsigned_long,duckdb::MultiFileLocalIndex&>
                (local_38,&local_48,(MultiFileLocalIndex *)&local_68);
      this_00 = local_40;
      __n_01 = (pointer)&__n_01->physical_type_;
      pMVar1 = (this->super_BaseFileReader).column_ids.column_ids.
               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               .
               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar2 = *(pointer *)
                ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                        .
                        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                        ._M_impl.super__Vector_impl_data + 8);
    } while (__n_01 < (undefined1 *)((long)pMVar2 - (long)pMVar1 >> 3));
    if (pMVar1 == pMVar2) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_01,
                 &(this->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    }
    if (((this->super_BaseFileReader).cast_map._M_h._M_element_count != 0) &&
       (*(pointer *)
         ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                 super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                 .
                 super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                 ._M_impl.super__Vector_impl_data + 8) !=
        (this->super_BaseFileReader).column_ids.column_ids.
        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        .
        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      __n_00 = 0;
      do {
        pvVar4 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                           (&this_00->column_ids,__n_00);
        local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pvVar4->column_id;
        iVar6 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LogicalType>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->super_BaseFileReader).cast_map._M_h,(key_type *)&local_68);
        if ((iVar6.
             super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>.
             _M_cur != (__node_type *)0x0) &&
           (pvVar5 = vector<duckdb::LogicalType,_true>::operator[](this_01,__n_00),
           pvVar5 != (reference)
                     ((long)iVar6.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>
                            ._M_cur + 0x10))) {
          pvVar5->id_ = *(LogicalTypeId *)
                         ((long)iVar6.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>
                                ._M_cur + 0x10);
          pvVar5->physical_type_ =
               *(PhysicalType *)
                ((long)iVar6.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>
                       ._M_cur + 0x11);
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&pvVar5->type_info_,
                     (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                     ((long)iVar6.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>
                            ._M_cur + 0x18));
        }
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)((long)*(pointer *)
                                       ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                                               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                               .
                                               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                                (long)(this->super_BaseFileReader).column_ids.column_ids.
                                      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                      .
                                      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    ppVar8 = (this->projection_ids).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (this->projection_ids).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar8 == ppVar3) {
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      uVar7 = (long)ppVar3 - (long)ppVar8 >> 4;
      lVar9 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar8,ppVar3,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar8,ppVar3);
      ppVar8 = (this->projection_ids).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((this->projection_ids).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar8) {
        lVar9 = 8;
        uVar7 = 0;
        do {
          pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                             (this_01,*(size_type *)((long)&ppVar8->first + lVar9));
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,
                     pvVar5);
          uVar7 = uVar7 + 1;
          ppVar8 = (this->projection_ids).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = lVar9 + 0x10;
        } while (uVar7 < (ulong)((long)(this->projection_ids).
                                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar8 >>
                                4));
      }
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_01,
               &local_68);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  }
  return;
}

Assistant:

void CSVFileScan::InitializeFileNamesTypes() {
	if (column_ids.empty()) {
		// This means that the columns from this file are irrelevant.
		// just read the first column
		file_types.emplace_back(LogicalType::VARCHAR);
		projected_columns.insert(0);
		projection_ids.emplace_back(0, 0);
		return;
	}

	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto col_idx = MultiFileLocalIndex(i);
		auto column_id = column_ids[col_idx];
		file_types.emplace_back(types[column_id.GetId()]);
		projected_columns.insert(column_id.GetId());
		projection_ids.emplace_back(column_id.GetId(), col_idx);
	}

	if (column_ids.empty()) {
		file_types = types;
	}

	// We need to be sure that our types are also following the cast_map
	if (!cast_map.empty()) {
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto local_idx = MultiFileLocalIndex(i);
			auto entry = cast_map.find(column_ids[local_idx].GetId());
			if (entry != cast_map.end()) {
				file_types[i] = entry->second;
			}
		}
	}

	// We sort the types on the order of the parsed chunk
	std::sort(projection_ids.begin(), projection_ids.end());
	vector<LogicalType> sorted_types;
	for (idx_t i = 0; i < projection_ids.size(); ++i) {
		sorted_types.push_back(file_types[projection_ids[i].second]);
	}
	file_types = sorted_types;
}